

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O0

string * __thiscall
mg::string::format<char*,unsigned_int>
          (string *__return_storage_ptr__,string *this,string *format,char *args,uint args_1)

{
  int iVar1;
  char *pcVar2;
  char *__format;
  size_t size;
  uint args_local_1;
  char *args_local;
  string *format_local;
  string *ret;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = snprintf((char *)0x0,0,pcVar2,format,(ulong)args & 0xffffffff);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  __format = (char *)std::__cxx11::string::c_str();
  snprintf(pcVar2,(long)(iVar1 + 1),__format,format,(ulong)args & 0xffffffff);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string &format, Args... args) {
  size_t size = snprintf(nullptr, 0, format.c_str(), args...) + 1;
  std::string ret;
  ret.resize(size);
  snprintf(&ret[0], size, format.c_str(), args...);
  ret.resize(size - 1);
  return ret;
}